

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

bool __thiscall
soplex::SPxSolverBase<double>::enter(SPxSolverBase<double> *this,SPxId *enterId,bool polish)

{
  SSVectorBase<double> *y;
  double dVar1;
  Real RVar2;
  SPxStatus stat;
  LPRowSetBase<double> *pLVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  pointer rhs_00;
  double *pdVar6;
  SPxOut *pSVar7;
  _func_int **pp_Var8;
  undefined7 in_register_00000011;
  DataKey *pDVar9;
  SSVectorBase<double> *x;
  DataKey DVar10;
  SPxBasisBase<double> *this_00;
  SSVectorBase<double> *pSVar11;
  ulong uVar12;
  UpdateVector<double> *pUVar13;
  bool bVar14;
  undefined4 uVar15;
  Status enterStat;
  double local_e8;
  undefined8 uStack_e0;
  double leavebound;
  double enterTest;
  double leaveVal;
  DataKey *local_b8;
  SPxId none;
  double local_a0;
  double enterMax;
  double enterVal;
  SPxBasisBase<double> *local_88;
  double local_80;
  StableSum<double> objChange;
  double enterRO;
  double enterLB;
  double enterUB;
  SVectorBase<double> *rhs;
  
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  objChange.sum = 0.0;
  objChange.c = 0.0;
  iVar4 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])();
  rhs = (SVectorBase<double> *)CONCAT44(extraout_var,iVar4);
  local_88 = (SPxBasisBase<double> *)CONCAT71(local_88._1_7_,this->instableEnter);
  local_b8 = &enterId->super_DataKey;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_80,
             &enterStat,&enterRO,&objChange);
  if ((int)CONCAT71(in_register_00000011,polish) == 0) {
    local_e8 = enterTest;
    dVar1 = epsilon(this);
    if (local_e8 <= -dVar1) goto LAB_001cd96f;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
              (SUB84(enterTest,0),this,*local_b8,(ulong)(uint)enterStat);
    pp_Var8 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
    bVar14 = false;
  }
  else {
LAB_001cd96f:
    pUVar13 = this->theFvec;
    if (((pUVar13->thedelta).setupStatus == true) && ((pUVar13->thedelta).super_IdxSet.num == 0)) {
      SPxBasisBase<double>::solve4update(&this->super_SPxBasisBase<double>,&pUVar13->thedelta,rhs);
    }
    if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[(ulong)(enterMax < 0.0) + 0x89])
                (this);
    }
    leaveVal = -enterMax;
    this->boundflips = 0;
    uVar5 = (*this->theratiotester->_vptr_SPxRatioTester[7])
                      (SUB84(enterTest,0),this->theratiotester,&leaveVal,polish);
    this->instableEnterVal = 0.0;
    (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
    this->instableEnter = false;
    bVar14 = -1 < (int)uVar5;
    if (bVar14) {
      local_e8 = ABS(leaveVal);
      uStack_e0 = 0;
      dVar1 = entertol(this);
      if (dVar1 <= local_e8) {
        this->m_numCycle = this->m_numCycle / 2;
      }
      else {
        local_e8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5] -
                   (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar5];
        uStack_e0 = 0;
        RVar2 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
        if (((RVar2 < ABS(local_e8)) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
          this->m_numCycle = this->m_numCycle + 1;
          this->enterCycles = this->enterCycles + 1;
        }
      }
      pSVar11 = this->coSolveVector2;
      y = this->coSolveVector3;
      this_00 = &this->super_SPxBasisBase<double>;
      x = &this->theCoPvec->thedelta;
      rhs_00 = (this->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5;
      if (y == (SSVectorBase<double> *)0x0) {
        if (pSVar11 == (SSVectorBase<double> *)0x0) {
          SPxBasisBase<double>::coSolve(this_00,x,&rhs_00->super_SVectorBase<double>);
        }
        else {
          SPxBasisBase<double>::coSolve
                    (this_00,x,pSVar11,&rhs_00->super_SVectorBase<double>,this->coSolveVector2rhs);
        }
      }
      else {
        if (pSVar11 == (SSVectorBase<double> *)0x0) {
          SPxBasisBase<double>::coSolve
                    (this_00,x,y,&rhs_00->super_SVectorBase<double>,this->coSolveVector3rhs);
        }
        else {
          SPxBasisBase<double>::coSolve
                    (this_00,x,pSVar11,y,&rhs_00->super_SVectorBase<double>,this->coSolveVector2rhs,
                     this->coSolveVector3rhs);
        }
        VectorBase<double>::operator-=
                  (&this->theCoPvec->super_VectorBase<double>,this->coSolveVector3);
      }
      if (0 < this->boundflips) {
        local_88 = this_00;
        for (uVar12 = (ulong)((long)(this->coSolveVector3->super_VectorBase<double>).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(this->coSolveVector3->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
            0 < (int)uVar12; uVar12 = uVar12 - 1) {
          local_e8 = ABS((this->coSolveVector3->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12 - 1]);
          uStack_e0 = 0;
          dVar1 = epsilon(this);
          if (dVar1 < local_e8) {
            leavebound = -(this->coSolveVector3->super_VectorBase<double>).val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12 - 1];
            VectorBase<double>::multAdd<double,double>
                      (&this->thePvec->super_VectorBase<double>,&leavebound,
                       (SVectorBase<double> *)
                       ((this->thecovectors->set).theitem +
                       (this->thecovectors->set).thekey[uVar12 - 1].idx));
          }
        }
        if (local_b8->info < 1) {
          pUVar13 = this->thePvec;
          SPxRowId::SPxRowId((SPxRowId *)&leavebound,(SPxId *)local_b8);
          pLVar3 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>;
        }
        else {
          pUVar13 = this->theCoPvec;
          SPxColId::SPxColId((SPxColId *)&leavebound,(SPxId *)local_b8);
          pLVar3 = (LPRowSetBase<double> *)
                   &(this->super_SPxLPBase<double>).super_LPColSetBase<double>;
        }
        iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                          (&(pLVar3->super_SVSetBase<double>).set,(DataKey *)&leavebound);
        local_80 = (pUVar13->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar4];
        this->totalboundflips = this->totalboundflips + this->boundflips;
        this_00 = local_88;
      }
      (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = enterRO;
      local_e8 = (enterRO - local_80) /
                 (this->theFvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar5];
      this->theCoPvec->theval = local_e8;
      dVar1 = epsilon(this);
      if (dVar1 < local_e8) {
LAB_001cdef5:
        if (this->thePricing == FULL) {
          this->thePvec->theval = this->theCoPvec->theval;
          (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])(this);
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
      }
      else {
        local_e8 = this->theCoPvec->theval;
        dVar1 = epsilon(this);
        if (local_e8 < -dVar1) goto LAB_001cdef5;
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x82])
                (enterMax._0_4_,this,(ulong)uVar5,&leavebound,&objChange);
      (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = enterUB;
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = enterLB;
      updateCoTest(this);
      if (this->thePricing == FULL) {
        updateTest(this);
      }
      pUVar13 = this->theFvec;
      pUVar13->theval = leaveVal;
      UpdateVector<double>::update(pUVar13);
      (this->theFvec->super_VectorBase<double>).val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = enterVal - leaveVal;
      local_e8 = leavebound;
      dVar1 = epsilon(this);
      if (dVar1 < local_e8) {
LAB_001ce00b:
        local_a0 = -leavebound;
        VectorBase<double>::multAdd<double,double>
                  (this->theFrhs,&local_a0,(this->super_SPxBasisBase<double>).matrix.data[uVar5]);
      }
      else {
        local_e8 = leavebound;
        dVar1 = epsilon(this);
        if (local_e8 < -dVar1) goto LAB_001ce00b;
      }
      local_e8 = enterVal;
      dVar1 = epsilon(this);
      if (dVar1 < local_e8) {
LAB_001ce07d:
        VectorBase<double>::multAdd<double,double>(this->theFrhs,&enterVal,rhs);
      }
      else {
        local_e8 = enterVal;
        dVar1 = epsilon(this);
        if (local_e8 < -dVar1) goto LAB_001ce07d;
      }
      updateNonbasicValue(this,objChange.sum + objChange.c);
      pSVar11 = &this->theFvec->thedelta;
      pp_Var8 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
      uVar12 = (ulong)uVar5;
      pDVar9 = local_b8;
      goto LAB_001ce11e;
    }
    local_e8 = leaveVal + enterMax;
    uStack_e0 = 0;
    RVar2 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    pDVar9 = local_b8;
    if (ABS(local_e8) <= RVar2) {
      if (!polish) {
        local_e8 = leaveVal;
        pdVar6 = (double *)infinity();
        if (local_e8 < *pdVar6) {
          local_e8 = leaveVal;
          pdVar6 = (double *)infinity();
          if (-*pdVar6 < local_e8) {
            (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                      (&this->super_SPxBasisBase<double>,0xffffffffffffffff,pDVar9,rhs,0);
            pUVar13 = this->theFvec;
            pUVar13->theval = leaveVal;
            UpdateVector<double>::update(pUVar13);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x83])
                      (SUB84(leaveVal,0),this,*pDVar9,(ulong)(uint)enterStat,rhs,&objChange);
            updateNonbasicValue(this,objChange.sum + objChange.c);
            return bVar14;
          }
        }
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
                (SUB84(enterTest,0),this,*pDVar9,(ulong)(uint)enterStat);
      (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                (&this->super_SPxBasisBase<double>,0xffffffffffffffff,&none,0,0);
      if (polish) {
        return bVar14;
      }
      if (1 < (this->super_SPxBasisBase<double>).updateCount) {
        pSVar7 = this->spxout;
        if ((pSVar7 != (SPxOut *)0x0) && (4 < (int)pSVar7->m_verbosity)) {
          leavebound = (double)CONCAT44(leavebound._4_4_,pSVar7->m_verbosity);
          local_a0 = (double)CONCAT44(local_a0._4_4_,5);
          (*pSVar7->_vptr_SPxOut[2])();
          pSVar7 = soplex::operator<<(this->spxout,"IENTER01 factorization triggered in ");
          pSVar7 = soplex::operator<<(pSVar7,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
        return bVar14;
      }
      local_e8 = ABS(enterTest);
      uStack_e0 = 0;
      dVar1 = entertol(this);
      pSVar7 = this->spxout;
      if (local_e8 < dVar1) {
        if ((pSVar7 != (SPxOut *)0x0) && (4 < (int)pSVar7->m_verbosity)) {
          leavebound = (double)CONCAT44(leavebound._4_4_,pSVar7->m_verbosity);
          local_a0 = (double)CONCAT44(local_a0._4_4_,5);
          (*pSVar7->_vptr_SPxOut[2])();
          pSVar7 = soplex::operator<<(this->spxout,
                                      "IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        SPxBasisBase<double>::coSolve
                  (&this->super_SPxBasisBase<double>,&this->theCoPvec->super_VectorBase<double>,
                   this->theCoPrhs);
        computePvec(this);
        computeCoTest(this);
        computeTest(this);
        return bVar14;
      }
      if ((pSVar7 != (SPxOut *)0x0) && (4 < (int)pSVar7->m_verbosity)) {
        leavebound = (double)CONCAT44(leavebound._4_4_,pSVar7->m_verbosity);
        local_a0 = (double)CONCAT44(local_a0._4_4_,5);
        (*pSVar7->_vptr_SPxOut[2])();
        pSVar7 = soplex::operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
        pSVar7 = soplex::operator<<(pSVar7,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar7->m_streams[pSVar7->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
      }
      if (this->theRep == ROW) {
        computeDualfarkas4Row(this,leaveVal,(SPxId)*pDVar9);
        stat = INFEASIBLE;
      }
      else {
        computePrimalray4Col(this,leaveVal,(SPxId)*pDVar9);
        stat = UNBOUNDED;
      }
      setBasisStatus(this,stat);
      return bVar14;
    }
    DVar10 = *local_b8;
    if ((char)local_88 == '\0') {
      (this->instableEnterId).super_DataKey = DVar10;
      this->instableEnterVal = enterTest;
      DVar10 = *local_b8;
      uVar15 = SUB84(enterTest / 10.0,0);
    }
    else {
      uVar15 = SUB84(enterTest,0);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
              (uVar15,this,DVar10,(ulong)(uint)enterStat);
    pp_Var8 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
  }
  this_00 = &this->super_SPxBasisBase<double>;
  uVar12 = 0xffffffffffffffff;
  rhs = (SVectorBase<double> *)0x0;
  pSVar11 = (SSVectorBase<double> *)0x0;
  pDVar9 = &none.super_DataKey;
LAB_001ce11e:
  (**pp_Var8)(this_00,uVar12,pDVar9,rhs,pSVar11);
  return bVar14;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}